

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::reserve
          (ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *this,size_t minSize)

{
  ulong uVar1;
  size_t sVar2;
  pool_ptr<soul::AST::Constant> *ppVar3;
  pool_ptr<soul::AST::Constant> *ppVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar1 = this->numAllocated;
  if (uVar1 < minSize) {
    uVar6 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar6 != 0) {
      ppVar4 = (pool_ptr<soul::AST::Constant> *)operator_new__(uVar6 * 8);
      sVar2 = this->numActive;
      if (sVar2 != 0) {
        ppVar3 = this->items;
        sVar5 = 0;
        do {
          ppVar4[sVar5].object = ppVar3[sVar5].object;
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
      }
      if ((4 < uVar1) && (this->items != (pool_ptr<soul::AST::Constant> *)0x0)) {
        operator_delete__(this->items);
      }
      this->items = ppVar4;
    }
    this->numAllocated = uVar6;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }